

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ParseHexUV(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,UniValue *v
          ,string *strName)

{
  long lVar1;
  bool bVar2;
  runtime_error *this;
  long in_FS_OFFSET;
  string_view str;
  string_view hex_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string strHex;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  strHex._M_dataplus._M_p = (pointer)&strHex.field_2;
  strHex._M_string_length = 0;
  strHex.field_2._M_local_buf[0] = '\0';
  if (v->typ == VSTR) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&strHex,&v->val);
  }
  str._M_str = strHex._M_dataplus._M_p;
  str._M_len = strHex._M_string_length;
  bVar2 = IsHex(str);
  if (bVar2) {
    hex_str._M_str = strHex._M_dataplus._M_p;
    hex_str._M_len = strHex._M_string_length;
    ParseHex<unsigned_char>(__return_storage_ptr__,hex_str);
    std::__cxx11::string::~string((string *)&strHex);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a0,strName," must be hexadecimal string (not \'");
    std::operator+(&local_80,&local_a0,&strHex);
    std::operator+(&local_60,&local_80,"\')");
    std::runtime_error::runtime_error(this,(string *)&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<unsigned char> ParseHexUV(const UniValue& v, const std::string& strName)
{
    std::string strHex;
    if (v.isStr())
        strHex = v.getValStr();
    if (!IsHex(strHex))
        throw std::runtime_error(strName + " must be hexadecimal string (not '" + strHex + "')");
    return ParseHex(strHex);
}